

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O2

void gray_raster_reset(QT_FT_Raster raster,char *pool_base,long pool_size)

{
  undefined1 auVar1 [16];
  
  if (raster != (QT_FT_Raster)0x0) {
    if (pool_size < 0x2000 || pool_base == (char *)0x0) {
      if (pool_base == (char *)0x0) {
        raster->worker = (PWorker)0x0;
        raster->buffer = (void *)0x0;
        raster->buffer_size = 0;
      }
      else {
        raster->buffer = pool_base;
        raster->worker = (PWorker)0x0;
        raster->buffer_size = pool_size;
      }
    }
    else {
      raster->worker = (PWorker)pool_base;
      raster->buffer = pool_base + 0x11e8;
      raster->buffer_size = pool_size - 0x11e8U & 0xffffffffffffffe8;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pool_size - 0x11e8U;
      raster->band_size = SUB164(auVar1 / ZEXT816(0xc0),0);
    }
    raster->buffer_allocated_size = pool_size;
  }
  return;
}

Assistant:

static void
  gray_raster_reset( QT_FT_Raster  raster,
                     char*      pool_base,
                     long       pool_size )
  {
    PRaster  rast = (PRaster)raster;

    if ( raster )
    {
      if ( pool_base && ( pool_size >= MINIMUM_POOL_SIZE ) )
      {
        PWorker  worker = (PWorker)pool_base;


        rast->worker      = worker;
        rast->buffer      = pool_base +
                              ( ( sizeof ( TWorker ) + sizeof ( TCell ) - 1 ) &
                                ~( sizeof ( TCell ) - 1 ) );
        rast->buffer_size = (long)( ( pool_base + pool_size ) -
                                    (char*)rast->buffer ) &
                                      ~( sizeof ( TCell ) - 1 );
        rast->band_size   = (int)( rast->buffer_size /
                                     ( sizeof ( TCell ) * 8 ) );
      }
      else if ( pool_base)
      { /* Case when there is a raster pool allocated, but it                */
        /* doesn't have the minimum size (and so memory will be reallocated) */
          rast->buffer = pool_base;
          rast->worker = NULL;
          rast->buffer_size = pool_size;
      }
      else
      {
        rast->buffer      = NULL;
        rast->buffer_size = 0;
        rast->worker      = NULL;
      }
      rast->buffer_allocated_size = pool_size;
    }
  }